

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

uint32_t extract_uint32(uint8_t *arg_pos)

{
  uint32_t arg;
  uint8_t *arg_pos_local;
  
  return (uint)arg_pos[3] |
         (uint)arg_pos[2] << 8 | (uint)arg_pos[1] << 0x10 | (uint)*arg_pos << 0x18;
}

Assistant:

static uint32_t extract_uint32(const uint8_t *arg_pos)
{
    uint32_t arg = 0;
    arg |= (((uint32_t)*arg_pos++) << 24);
    arg |= (((uint32_t)*arg_pos++) << 16);
    arg |= (((uint32_t)*arg_pos++) << 8);
    arg |= (((uint32_t)*arg_pos++));
    return arg;
}